

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

RelationshipProperty * __thiscall
tinyusdz::RelationshipProperty::operator=(RelationshipProperty *this,RelationshipProperty *param_1)

{
  this->_authored = param_1->_authored;
  (this->_relationship).type = (param_1->_relationship).type;
  Path::operator=(&(this->_relationship).targetPath,&(param_1->_relationship).targetPath);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::_M_move_assign
            (&(this->_relationship).targetPathVector,&(param_1->_relationship).targetPathVector);
  (this->_relationship).listOpQual = (param_1->_relationship).listOpQual;
  AttrMetas::operator=(&(this->_relationship)._metas,&(param_1->_relationship)._metas);
  (this->_relationship)._varying_authored = (param_1->_relationship)._varying_authored;
  return this;
}

Assistant:

RelationshipProperty() = default;